

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularQueue.hpp
# Opt level: O0

void __thiscall
antlr::CircularQueue<antlr::TokenRefCount<antlr::Token>_>::removeItems
          (CircularQueue<antlr::TokenRefCount<antlr::Token>_> *this,size_t nb)

{
  CircularQueue<antlr::TokenRefCount<antlr::Token>_> *pCVar1;
  __normal_iterator<antlr::TokenRefCount<antlr::Token>_*,_std::vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>_>
  this_00;
  __normal_iterator<antlr::TokenRefCount<antlr::Token>_*,_std::vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>_>
  __last;
  CircularQueue<antlr::TokenRefCount<antlr::Token>_> *in_RSI;
  vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
  *in_RDI;
  CircularQueue<antlr::TokenRefCount<antlr::Token>_> *this_01;
  __normal_iterator<antlr::TokenRefCount<antlr::Token>_*,_std::vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>_>
  *in_stack_ffffffffffffffb8;
  const_iterator in_stack_ffffffffffffffd8;
  CircularQueue<antlr::TokenRefCount<antlr::Token>_> *local_10;
  
  this_01 = in_RSI;
  pCVar1 = (CircularQueue<antlr::TokenRefCount<antlr::Token>_> *)entries(in_RSI);
  local_10 = in_RSI;
  if (pCVar1 < this_01) {
    local_10 = (CircularQueue<antlr::TokenRefCount<antlr::Token>_> *)entries(this_01);
  }
  if (in_RDI[1].
      super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
      ._M_impl.super__Vector_impl_data._M_start < (pointer)0x1388) {
    in_RDI[1].
    super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((long)&(in_RDI[1].
                           super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->ref +
                  (long)&(local_10->storage).
                         super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    std::
    vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
    ::begin(in_RDI);
    __gnu_cxx::
    __normal_iterator<antlr::TokenRefCount<antlr::Token>const*,std::vector<antlr::TokenRefCount<antlr::Token>,std::allocator<antlr::TokenRefCount<antlr::Token>>>>
    ::__normal_iterator<antlr::TokenRefCount<antlr::Token>*>
              ((__normal_iterator<const_antlr::TokenRefCount<antlr::Token>_*,_std::vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>_>
                *)this_01,
               (__normal_iterator<antlr::TokenRefCount<antlr::Token>_*,_std::vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>_>
                *)in_RDI);
    std::
    vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
    ::begin(in_RDI);
    this_00 = __gnu_cxx::
              __normal_iterator<antlr::TokenRefCount<antlr::Token>_*,_std::vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>_>
              ::operator+(in_stack_ffffffffffffffb8,(difference_type)this_01);
    __last = __gnu_cxx::
             __normal_iterator<antlr::TokenRefCount<antlr::Token>_*,_std::vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>_>
             ::operator+(in_stack_ffffffffffffffb8,(difference_type)this_01);
    __gnu_cxx::
    __normal_iterator<antlr::TokenRefCount<antlr::Token>const*,std::vector<antlr::TokenRefCount<antlr::Token>,std::allocator<antlr::TokenRefCount<antlr::Token>>>>
    ::__normal_iterator<antlr::TokenRefCount<antlr::Token>*>
              ((__normal_iterator<const_antlr::TokenRefCount<antlr::Token>_*,_std::vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>_>
                *)this_01,
               (__normal_iterator<antlr::TokenRefCount<antlr::Token>_*,_std::vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>_>
                *)in_RDI);
    std::
    vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
    ::erase((vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
             *)this_00._M_current,in_stack_ffffffffffffffd8,(const_iterator)__last._M_current);
    in_RDI[1].
    super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  return;
}

Assistant:

inline void removeItems( size_t nb )
	{
		// it would be nice if we would not get called with nb > entries
		// (or to be precise when entries() == 0)
		// This case is possible when lexer/parser::recover() calls
		// consume+consumeUntil when the queue is empty.
		// In recover the consume says to prepare to read another
		// character/token. Then in the subsequent consumeUntil the
		// LA() call will trigger
		// syncConsume which calls this method *before* the same queue
		// has been sufficiently filled.
		if( nb > entries() )
			nb = entries();

		if (m_offset >= OFFSET_MAX_RESIZE)
		{
			storage.erase( storage.begin(), storage.begin() + m_offset + nb );
			m_offset = 0;
		}
		else
			m_offset += nb;
	}